

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopll.c
# Opt level: O0

void NOPLL_Reset(opll_t *chip,uint32_t chip_type,uint32_t rate,uint32_t clock)

{
  int iVar1;
  uint local_20;
  uint32_t i;
  uint32_t clock_local;
  uint32_t rate_local;
  uint32_t chip_type_local;
  opll_t *chip_local;
  
  memset(chip,0,0x8200);
  chip->clock = clock;
  chip->smplRate = rate;
  chip->chip_type = chip_type;
  if (chip_type == 1) {
    chip->rhythm = ' ';
    chip->rm_enable = -0x80;
  }
  switch(chip_type) {
  case 0:
  case 2:
  case 5:
  default:
    chip->patchrom = patch_ym2413;
    break;
  case 1:
    chip->patchrom = patch_ds1001;
    break;
  case 3:
  case 4:
    chip->patchrom = patch_ymf281;
    break;
  case 6:
    chip->patchrom = patch_ym2423;
  }
  for (local_20 = 0; local_20 < 0x12; local_20 = local_20 + 1) {
    chip->eg_state[local_20] = '\x03';
    chip->eg_level[local_20] = '\x7f';
    chip->eg_out = '\x7f';
  }
  chip->rm_select = 6;
  chip->rateratio = (int32_t)(((ulong)chip->smplRate * 0x12000) / (ulong)chip->clock);
  iVar1 = chip->rateratio + -0x400;
  if (iVar1 < 1) {
    iVar1 = -iVar1;
  }
  if (iVar1 < 2) {
    chip->rateratio = 0x400;
  }
  return;
}

Assistant:

void NOPLL_Reset(opll_t *chip, uint32_t chip_type, uint32_t rate, uint32_t clock) {
    uint32_t i;
    memset(chip, 0, sizeof(opll_t));
    chip->clock = clock;
    chip->smplRate = rate;
    chip->chip_type = chip_type;
    if (chip_type == opll_type_ds1001) {
        /* Rhythm mode is always on */
        chip->rhythm = 0x20;
        chip->rm_enable = (int8_t)0x80;
    }
    switch (chip_type) {
    case opll_type_ds1001:
        chip->patchrom = patch_ds1001;
        break;
    case opll_type_ymf281:
    case opll_type_ymf281b:
        chip->patchrom = patch_ymf281;
        break;
    case opll_type_ym2423:
        chip->patchrom = patch_ym2423;
        break;
    case opll_type_ym2413:
    case opll_type_ym2413b:
    case opll_type_ym2420:
    default:
        chip->patchrom = patch_ym2413;
        break;
    }
    for (i = 0; i < 18; i++) {
        chip->eg_state[i] = eg_num_release;
        chip->eg_level[i] = 0x7f;
        chip->eg_out = 0x7f;
    }
    chip->rm_select = rm_num_tc + 1;

    // ratio: sampleRate / (clock / 72) * (1 << resamplerFraction)
    chip->rateratio = (int32_t)((((uint64_t)72 * chip->smplRate) << RSM_FRAC) / chip->clock);
    if (abs(chip->rateratio - (1 << RSM_FRAC)) <= 1)
        chip->rateratio = (1 << RSM_FRAC);
}